

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O0

float rsg::anon_unknown_0::computeEntryReadWeight
                (ConstValueRangeAccess entryValueRange,ConstValueRangeAccess readValueRange)

{
  Scalar **this;
  bool bVar1;
  Type TVar2;
  int iVar3;
  int iVar4;
  TestError *this_00;
  float fVar5;
  float local_250;
  float local_24c;
  bool local_245;
  float local_240;
  float local_23c;
  bool local_235;
  float elementWeight_1;
  float readRatio_1;
  float entryRatio_1;
  deInt64 intersectionLen_1;
  deInt64 readRangeLen_1;
  deInt64 entryRangeLen_1;
  int intersectionMax_1;
  int intersectionMin_1;
  Scalar local_1d0;
  Scalar local_1cc;
  ConstValueRangeAccess local_1c8;
  ConstValueAccess local_1b0;
  int local_19c;
  undefined1 local_198 [4];
  int readMax_1;
  ConstValueAccess local_180;
  int local_16c;
  undefined1 local_168 [4];
  int readMin_1;
  ConstValueAccess local_150;
  int local_13c;
  undefined1 local_138 [4];
  int entryMax_1;
  ConstValueAccess local_120;
  int local_110;
  int local_10c;
  int entryMin_1;
  int elemNdx_1;
  float elementWeight;
  float readRatio;
  float entryRatio;
  float intersectionLen;
  float readRangeLen;
  float entryRangeLen;
  float intersectionMax;
  float intersectionMin;
  Scalar local_e0;
  Scalar local_dc;
  ConstValueRangeAccess local_d8;
  ConstValueAccess local_c0;
  float local_ac;
  undefined1 local_a8 [4];
  float readMax;
  ConstValueAccess local_90;
  float local_7c;
  undefined1 local_78 [4];
  float readMin;
  ConstValueAccess local_60;
  float local_4c;
  undefined1 local_48 [4];
  float entryMax;
  ConstValueAccess local_30;
  float local_1c;
  int local_18;
  float entryMin;
  int elemNdx;
  float weight;
  VariableType *type;
  
  this = &entryValueRange.m_max;
  _elemNdx = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&stack0x00000008);
  entryMin = 1.0;
  TVar2 = VariableType::getBaseType(_elemNdx);
  switch(TVar2) {
  case TYPE_FLOAT:
    for (local_18 = 0; iVar4 = local_18, iVar3 = VariableType::getNumElements(_elemNdx),
        iVar4 < iVar3; local_18 = local_18 + 1) {
      ConstValueRangeAccess::component
                ((ConstValueRangeAccess *)local_48,(ConstValueRangeAccess *)&stack0x00000008,
                 local_18);
      local_30 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_48);
      local_1c = ConstStridedValueAccess<1>::asFloat(&local_30);
      ConstValueRangeAccess::component
                ((ConstValueRangeAccess *)local_78,(ConstValueRangeAccess *)&stack0x00000008,
                 local_18);
      local_60 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_78);
      local_4c = ConstStridedValueAccess<1>::asFloat(&local_60);
      ConstValueRangeAccess::component
                ((ConstValueRangeAccess *)local_a8,(ConstValueRangeAccess *)this,local_18);
      local_90 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_a8);
      local_7c = ConstStridedValueAccess<1>::asFloat(&local_90);
      ConstValueRangeAccess::component(&local_d8,(ConstValueRangeAccess *)this,local_18);
      local_c0 = ConstValueRangeAccess::getMax(&local_d8);
      local_ac = ConstStridedValueAccess<1>::asFloat(&local_c0);
      local_dc = Scalar::min<float>();
      Scalar::Scalar((Scalar *)&local_e0.boolVal,local_1c);
      bVar1 = Scalar::operator==((Scalar *)&local_dc.boolVal,local_e0);
      local_235 = false;
      if (bVar1) {
        intersectionMin = (float)Scalar::max<float>();
        Scalar::Scalar((Scalar *)&intersectionMax,local_4c);
        local_235 = Scalar::operator==((Scalar *)&intersectionMin,(Scalar)intersectionMax);
      }
      if (local_235 == false) {
        entryRangeLen = deFloatMax(local_1c,local_7c);
        readRangeLen = deFloatMin(local_4c,local_ac);
        intersectionLen = local_4c - local_1c;
        entryRatio = local_ac - local_7c;
        readRatio = readRangeLen - entryRangeLen;
        if (intersectionLen <= 0.0) {
          local_23c = 1.0;
        }
        else {
          local_23c = readRatio / intersectionLen;
        }
        elementWeight = local_23c;
        if (entryRatio <= 0.0) {
          local_240 = 1.0;
        }
        else {
          local_240 = readRatio / entryRatio;
        }
        elemNdx_1 = (int)local_240;
        entryMin_1 = (int)(local_240 * 0.5 + local_23c * 0.5);
        entryMin = combineWeight(entryMin,(float)entryMin_1);
      }
    }
    break;
  case TYPE_INT:
    for (local_10c = 0; iVar4 = local_10c, iVar3 = VariableType::getNumElements(_elemNdx),
        iVar4 < iVar3; local_10c = local_10c + 1) {
      ConstValueRangeAccess::component
                ((ConstValueRangeAccess *)local_138,(ConstValueRangeAccess *)&stack0x00000008,
                 local_10c);
      local_120 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_138);
      local_110 = ConstStridedValueAccess<1>::asInt(&local_120);
      ConstValueRangeAccess::component
                ((ConstValueRangeAccess *)local_168,(ConstValueRangeAccess *)&stack0x00000008,
                 local_10c);
      local_150 = ConstValueRangeAccess::getMax((ConstValueRangeAccess *)local_168);
      local_13c = ConstStridedValueAccess<1>::asInt(&local_150);
      ConstValueRangeAccess::component
                ((ConstValueRangeAccess *)local_198,(ConstValueRangeAccess *)this,local_10c);
      local_180 = ConstValueRangeAccess::getMin((ConstValueRangeAccess *)local_198);
      local_16c = ConstStridedValueAccess<1>::asInt(&local_180);
      ConstValueRangeAccess::component(&local_1c8,(ConstValueRangeAccess *)this,local_10c);
      local_1b0 = ConstValueRangeAccess::getMax(&local_1c8);
      local_19c = ConstStridedValueAccess<1>::asInt(&local_1b0);
      local_1cc = Scalar::min<int>();
      Scalar::Scalar((Scalar *)&local_1d0.boolVal,local_110);
      bVar1 = Scalar::operator==((Scalar *)&local_1cc.boolVal,local_1d0);
      local_245 = false;
      if (bVar1) {
        intersectionMin_1 = (int)Scalar::max<int>();
        Scalar::Scalar((Scalar *)&intersectionMax_1,local_13c);
        local_245 = Scalar::operator==((Scalar *)&intersectionMin_1,(Scalar)intersectionMax_1);
      }
      if (local_245 == false) {
        iVar4 = deMax32(local_110,local_16c);
        iVar3 = deMin32(local_13c,local_19c);
        if ((long)local_13c - (long)local_110 < 1) {
          local_24c = 1.0;
        }
        else {
          local_24c = (float)((long)iVar3 - (long)iVar4) /
                      (float)((long)local_13c - (long)local_110);
        }
        if ((long)local_19c - (long)local_16c < 1) {
          local_250 = 1.0;
        }
        else {
          local_250 = (float)((long)iVar3 - (long)iVar4) /
                      (float)((long)local_19c - (long)local_16c);
        }
        entryMin = combineWeight(entryMin,local_250 * 0.5 + local_24c * 0.5);
      }
    }
    break;
  case TYPE_BOOL:
    break;
  case TYPE_STRUCT:
  case TYPE_ARRAY:
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unsupported type",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/randomshaders/rsgExpression.cpp"
               ,0x432);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  fVar5 = deFloatMax(entryMin,0.01);
  return fVar5;
}

Assistant:

float computeEntryReadWeight (ConstValueRangeAccess entryValueRange, ConstValueRangeAccess readValueRange)
{
	const VariableType& type = entryValueRange.getType();
	DE_ASSERT(type == readValueRange.getType());

	float weight = 1.0f;

	switch (type.getBaseType())
	{
		case VariableType::TYPE_FLOAT:
		{
			for (int elemNdx = 0; elemNdx < type.getNumElements(); elemNdx++)
			{
				float entryMin	= entryValueRange.component(elemNdx).getMin().asFloat();
				float entryMax	= entryValueRange.component(elemNdx).getMax().asFloat();
				float readMin	= readValueRange.component(elemNdx).getMin().asFloat();
				float readMax	= readValueRange.component(elemNdx).getMax().asFloat();

				// Check for -inf..inf ranges - they don't bring down the weight.
				if (Scalar::min<float>() == entryMin && Scalar::max<float>() == entryMax)
					continue;

				// Intersection to entry value range length ratio.
				float intersectionMin		= deFloatMax(entryMin, readMin);
				float intersectionMax		= deFloatMin(entryMax, readMax);
				float entryRangeLen			= entryMax - entryMin;
				float readRangeLen			= readMax - readMin;
				float intersectionLen		= intersectionMax - intersectionMin;
				float entryRatio			= (entryRangeLen	> 0.0f) ? (intersectionLen / entryRangeLen)	: 1.0f;
				float readRatio				= (readRangeLen		> 0.0f) ? (intersectionLen / readRangeLen)	: 1.0f;
				float elementWeight			= 0.5f*readRatio + 0.5f*entryRatio;

				weight = combineWeight(weight, elementWeight);
			}
			break;
		}

		case VariableType::TYPE_INT:
		{
			for (int elemNdx = 0; elemNdx < type.getNumElements(); elemNdx++)
			{
				int entryMin	= entryValueRange.component(elemNdx).getMin().asInt();
				int entryMax	= entryValueRange.component(elemNdx).getMax().asInt();
				int readMin		= readValueRange.component(elemNdx).getMin().asInt();
				int readMax		= readValueRange.component(elemNdx).getMax().asInt();

				// Check for -inf..inf ranges - they don't bring down the weight.
				if (Scalar::min<int>() == entryMin && Scalar::max<int>() == entryMax)
					continue;

				// Intersection to entry value range length ratio.
				int		intersectionMin			= deMax32(entryMin, readMin);
				int		intersectionMax			= deMin32(entryMax, readMax);
				deInt64 entryRangeLen			= (deInt64)entryMax - (deInt64)entryMin;
				deInt64	readRangeLen			= (deInt64)readMax - (deInt64)readMin;
				deInt64	intersectionLen			= (deInt64)intersectionMax - (deInt64)intersectionMin;
				float	entryRatio				= (entryRangeLen	> 0) ? ((float)intersectionLen / (float)entryRangeLen)	: 1.0f;
				float	readRatio				= (readRangeLen		> 0) ? ((float)intersectionLen / (float)readRangeLen)	: 1.0f;
				float	elementWeight			= 0.5f*readRatio + 0.5f*entryRatio;

				weight = combineWeight(weight, elementWeight);
			}
			break;
		}

		case VariableType::TYPE_BOOL:
		{
			// \todo
			break;
		}


		case VariableType::TYPE_ARRAY:
		case VariableType::TYPE_STRUCT:

		default:
			TCU_FAIL("Unsupported type");
	}

	return deFloatMax(weight, 0.01f);
}